

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

void nni_sleep_aio(nng_duration ms,nng_aio *aio)

{
  uint uVar1;
  nni_time nVar2;
  
  nni_aio_reset(aio);
  aio->a_sleep = true;
  aio->a_expire_ok = true;
  uVar1 = aio->a_timeout;
  if (uVar1 < 0xfffffffe) {
    if (ms == -1 || (int)uVar1 < ms) {
      aio->a_expire_ok = false;
      ms = uVar1;
    }
  }
  else if (ms == -1) {
    nVar2 = 0xffffffffffffffff;
    goto LAB_0010f1c0;
  }
  nVar2 = nni_clock();
  nVar2 = (long)ms + nVar2;
LAB_0010f1c0:
  aio->a_expire = nVar2;
  nni_aio_start(aio,nni_sleep_cancel,(void *)0x0);
  return;
}

Assistant:

void
nni_sleep_aio(nng_duration ms, nng_aio *aio)
{
	nni_aio_reset(aio);
	aio->a_expire_ok = true;
	aio->a_sleep     = true;
	switch (aio->a_timeout) {
	case NNG_DURATION_DEFAULT:
	case NNG_DURATION_INFINITE:
		// No premature timeout, honor our expected values.
		break;
	default:
		// If the timeout on the aio is shorter than our sleep time,
		// then let it still wake up early, but with NNG_ETIMEDOUT.
		if ((ms == NNG_DURATION_INFINITE) || (ms > aio->a_timeout)) {
			aio->a_expire_ok = false;
			ms               = aio->a_timeout;
		}
	}
	aio->a_expire =
	    ms == NNG_DURATION_INFINITE ? NNI_TIME_NEVER : nni_clock() + ms;

	// we don't do anything else here, so we can ignore the return
	(void) nni_aio_start(aio, nni_sleep_cancel, NULL);
}